

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O1

bool __thiscall amrex::BoxArray::CellEqual(BoxArray *this,BoxArray *rhs)

{
  element_type *peVar1;
  element_type *peVar2;
  Box *pBVar3;
  bool bVar4;
  Box *this_00;
  Box *b;
  IntVect IVar5;
  IntVect IVar6;
  
  IVar5 = BATransformer::coarsen_ratio(&this->m_bat);
  IVar6 = BATransformer::coarsen_ratio(&rhs->m_bat);
  if ((IVar5.vect[0] == IVar6.vect[0]) &&
     (IVar5.vect[2] == IVar6.vect[2] && (IVar6.vect._0_8_ ^ IVar5.vect._0_8_) >> 0x20 == 0)) {
    peVar1 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar2 = (rhs->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 == peVar2) {
      return true;
    }
    this_00 = (peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_start;
    pBVar3 = *(pointer *)
              ((long)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data + 8);
    b = (peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start;
    if ((long)pBVar3 - (long)this_00 ==
        (long)*(pointer *)
               ((long)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data + 8) - (long)b) {
      if (this_00 == pBVar3) {
        return this_00 == pBVar3;
      }
      bVar4 = Box::operator==(this_00,b);
      if (bVar4) {
        do {
          b = b + 1;
          this_00 = this_00 + 1;
          if (this_00 == pBVar3) {
            return this_00 == pBVar3;
          }
          bVar4 = Box::operator==(this_00,b);
        } while (bVar4);
        return false;
      }
    }
  }
  return false;
}

Assistant:

bool
BoxArray::CellEqual (const BoxArray& rhs) const noexcept
{
    return crseRatio() == rhs.crseRatio()
        && (m_ref == rhs.m_ref || m_ref->m_abox == rhs.m_ref->m_abox);
}